

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int lj_gc_step_jit(global_State *g,MSize steps)

{
  int iVar1;
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  lua_State *L;
  bool local_1a;
  int local_c;
  
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 0xf4);
  L_00->base = (TValue *)(ulong)*(uint *)((ulong)(L_00->glref).ptr32 + 0xf8);
  L_00->top = L_00->base +
              (int)(uint)*(byte *)((ulong)*(uint *)((ulong)L_00->base[-1].u32.lo + 0x10) - 0x39);
  local_c = in_ESI;
  do {
    bVar2 = false;
    if (local_c != 0) {
      iVar1 = lj_gc_step(L_00);
      bVar2 = iVar1 == 0;
    }
    local_c = local_c + -1;
  } while (bVar2);
  local_1a = true;
  if (*(char *)((ulong)(L_00->glref).ptr32 + 0x29) != '\x02') {
    local_1a = *(char *)((ulong)(L_00->glref).ptr32 + 0x29) == '\x05';
  }
  return (int)local_1a;
}

Assistant:

int LJ_FASTCALL lj_gc_step_jit(global_State *g, MSize steps)
{
  lua_State *L = gco2th(gcref(g->jit_L));
  L->base = mref(G(L)->jit_base, TValue);
  L->top = curr_topL(L);
  while (steps-- > 0 && lj_gc_step(L) == 0)
    ;
  /* Return 1 to force a trace exit. */
  return (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize);
}